

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O2

void __thiscall
Memory::
PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
::ReleasePages(PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
               *this,void *address,uint pageCount,void *segmentParam)

{
  DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *this_00;
  undefined4 *puVar1;
  HANDLE pVVar2;
  code *pcVar3;
  bool bVar4;
  int iVar5;
  HANDLE pVVar6;
  DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *fromSegmentList;
  PageSegmentBase<Memory::VirtualAllocWrapper> *pPVar7;
  ulong uVar8;
  ulong pageCount_00;
  undefined8 *in_FS_OFFSET;
  
  if (this->maxAllocPageCount < pageCount) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x635,"(pageCount <= this->maxAllocPageCount)",
                       "pageCount <= this->maxAllocPageCount");
    if (!bVar4) goto LAB_002713d6;
    *puVar1 = 0;
  }
  bVar4 = ValidThreadAccess(this);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x637,"(this->ValidThreadAccess())",
                       "Page allocation should only be used by a single thread");
    if (!bVar4) goto LAB_002713d6;
    *puVar1 = 0;
  }
  iVar5 = (*this->_vptr_PageAllocatorBase[3])(this);
  if ((char)iVar5 != '\0') {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x638,"(!this->HasMultiThreadAccess())","!this->HasMultiThreadAccess()");
    if (!bVar4) goto LAB_002713d6;
    *puVar1 = 0;
  }
  if (this->disablePageReuse == true) {
    pVVar2 = this->processHandle;
    pVVar6 = GetCurrentProcess();
    if (pVVar2 != pVVar6) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar1 = (undefined4 *)*in_FS_OFFSET;
      *puVar1 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                         ,0x63d,"(this->processHandle == GetCurrentProcess())",
                         "this->processHandle == GetCurrentProcess()");
      if (!bVar4) {
LAB_002713d6:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar1 = 0;
    }
    VirtualFree(address,(ulong)(pageCount << 0xc),0x4000);
    return;
  }
  PageTracking::ReportFree(this,address,(ulong)(pageCount << 0xc));
  fromSegmentList =
       GetSegmentList(this,(PageSegmentBase<Memory::VirtualAllocWrapper> *)segmentParam);
  if (fromSegmentList ==
      (DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x647,"(fromSegmentList != nullptr)","fromSegmentList != nullptr");
    if (!bVar4) goto LAB_002713d6;
    *puVar1 = 0;
  }
  pageCount_00 = (ulong)pageCount;
  if ((ulong)this->maxFreePageCount < this->freePageCount + pageCount_00) {
    if ((this->zeroPages != false) ||
       (this_00 = &this->emptySegments,
       (DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *)
       (this->emptySegments).
       super_DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>.next.base ==
       this_00)) {
      PageSegmentBase<Memory::VirtualAllocWrapper>::DecommitPages<false>
                ((PageSegmentBase<Memory::VirtualAllocWrapper> *)segmentParam,address,pageCount);
      LogFreePages(this,pageCount_00);
      LogDecommitPages(this,pageCount_00);
      this->decommitPageCount = this->decommitPageCount + pageCount_00;
      goto LAB_002713b9;
    }
    pPVar7 = DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount>::Head
                       (this_00);
    if (pPVar7->decommitPageCount != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar1 = (undefined4 *)*in_FS_OFFSET;
      *puVar1 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                         ,0x65f,"(emptySegments.Head().GetDecommitPageCount() == 0)",
                         "emptySegments.Head().GetDecommitPageCount() == 0");
      if (!bVar4) goto LAB_002713d6;
      *puVar1 = 0;
    }
    pPVar7 = DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount>::Head
                       (this_00);
    LogFreeSegment(this,&pPVar7->super_SegmentBase<Memory::VirtualAllocWrapper>);
    DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount>::
    RemoveHead<Memory::NoThrowHeapAllocator>
              (this_00,(NoThrowHeapAllocator *)&NoThrowHeapAllocator::Instance);
    uVar8 = this->freePageCount - (ulong)this->maxAllocPageCount;
    this->freePageCount = uVar8;
    if (uVar8 < this->debugMinFreePageCount) {
      this->debugMinFreePageCount = uVar8;
    }
  }
  else if ((Js::Configuration::Global[0x2c158] == '\x01') && (this->queueZeroPages == true)) {
    bVar4 = HasZeroPageQueue(this);
    if (!bVar4) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar1 = (undefined4 *)*in_FS_OFFSET;
      *puVar1 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                         ,0x67e,"(HasZeroPageQueue())","HasZeroPageQueue()");
      if (!bVar4) goto LAB_002713d6;
      *puVar1 = 0;
    }
    AddPageToZeroQueue(this,address,pageCount,
                       (PageSegmentBase<Memory::VirtualAllocWrapper> *)segmentParam);
    return;
  }
  memset(address,0xfe,(ulong)(pageCount << 0xc));
  PageSegmentBase<Memory::VirtualAllocWrapper>::ReleasePages
            ((PageSegmentBase<Memory::VirtualAllocWrapper> *)segmentParam,address,pageCount);
  LogFreePages(this,pageCount_00);
  AddFreePageCount(this,pageCount);
LAB_002713b9:
  TransferSegment(this,(PageSegmentBase<Memory::VirtualAllocWrapper> *)segmentParam,fromSegmentList)
  ;
  return;
}

Assistant:

void
PageAllocatorBase<TVirtualAlloc, TSegment, TPageSegment>::ReleasePages(__in void * address, uint pageCount, __in void * segmentParam)
{
    Assert(pageCount <= this->maxAllocPageCount);
    TPageSegment * segment = (TPageSegment*) segmentParam;
    ASSERT_THREAD();
    Assert(!this->HasMultiThreadAccess());

#ifdef RECYCLER_NO_PAGE_REUSE
    if (disablePageReuse)
    {
        Assert(this->processHandle == GetCurrentProcess());
#pragma prefast(suppress:6250, "Calling 'VirtualFree' without the MEM_RELEASE flag might free memory but not address descriptors (VADs).")
        VirtualFree(address, pageCount * AutoSystemInfo::PageSize, MEM_DECOMMIT);
        return;
    }
#endif

    PageTracking::ReportFree((PageAllocator*)this, address, AutoSystemInfo::PageSize * pageCount);

    DListBase<TPageSegment> * fromSegmentList = GetSegmentList(segment);
    Assert(fromSegmentList != nullptr);

    /**
     * The logic here is as follows:
     * - If we have sufficient pages already, such that the newly free pages are going
     *   to cause us to exceed the threshold of free pages we want:
     *     - First check and see if we have empty segments. If we do, just release that
     *       entire segment back to the operating system, and add the current segments
     *       free pages to our free page pool
     *     - Otherwise, if there are no empty segments (i.e our memory is fragmented),
     *       decommit the pages that are being released so that they don't count towards
     *       our working set
     * - If we don't have enough pages:
     *    - If we're in the free page queuing mode where we have a "pages to zero out" queue
     *      put it in that queue and we're done
     *    - Otherwise, zero it out, and add it to the free page pool
     *  Now that we've either decommitted or freed the pages in the segment,
     *  move the segment to the right segment list
     */
    if (this->freePageCount + pageCount > maxFreePageCount)
    {
        // Release a whole segment if possible to reduce the number of VirtualFree and fragmentation
        if (!ZeroPages() && !emptySegments.Empty())
        {
            Assert(emptySegments.Head().GetDecommitPageCount() == 0);
            LogFreeSegment(&emptySegments.Head());
            emptySegments.RemoveHead(&NoThrowNoMemProtectHeapAllocator::Instance);
            this->freePageCount -= maxAllocPageCount;

#if DBG
            UpdateMinimum(this->debugMinFreePageCount, this->freePageCount);
            MemSetLocal(address, DbgMemFill, AutoSystemInfo::PageSize * pageCount);
#endif
            segment->ReleasePages(address, pageCount);
            LogFreePages(pageCount);
            this->AddFreePageCount(pageCount);

        }
        else
        {
            segment->template DecommitPages<false>(address, pageCount);
            LogFreePages(pageCount);
            LogDecommitPages(pageCount);
#if DBG_DUMP
            this->decommitPageCount += pageCount;
#endif
        }
    }
    else
    {
#if ENABLE_BACKGROUND_PAGE_ZEROING
        if (CONFIG_FLAG(EnableBGFreeZero))
        {
            if (QueueZeroPages())
            {
                Assert(HasZeroPageQueue());
                AddPageToZeroQueue(address, pageCount, segment);
                return;
            }
        }
#endif

        this->FillFreePages((char *)address, pageCount);
        segment->ReleasePages(address, pageCount);
        LogFreePages(pageCount);
        this->AddFreePageCount(pageCount);
    }

    TransferSegment(segment, fromSegmentList);
}